

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTests.cpp
# Opt level: O2

void checkTimeLiteral(string *s,TimeUnit flagCheck,double num)

{
  __type_conflict4 _Var1;
  NumericTokenFlags NVar2;
  SourceManager *sourceManager;
  string_view text;
  Token TVar3;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  TimeUnit flagCheck_local;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_a8;
  string local_98;
  undefined1 local_78 [8];
  undefined8 local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  string *local_50;
  double local_48;
  Token token;
  
  text._M_str = (s->_M_dataplus)._M_p;
  text._M_len = s->_M_string_length;
  flagCheck_local = flagCheck;
  local_48 = num;
  TVar3 = lexToken(text,Default);
  local_78 = (undefined1  [8])0x88d9a8;
  local_70 = 0x2cc;
  capturedExpression.m_size = 0x24;
  capturedExpression.m_start = "token.kind == TokenKind::TimeLiteral";
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  token = TVar3;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)local_78,capturedExpression,
             ContinueOnFailure);
  local_50 = &local_98;
  local_70._0_2_ = CONCAT11(TVar3.kind == TimeLiteral,true);
  local_98._M_dataplus._M_p._0_2_ = 9;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b64e40;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_68._M_allocated_capacity = (size_type)&token;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_78 = (undefined1  [8])0x88d9a8;
  local_70 = 0x2cd;
  capturedExpression_00.m_size = 0x15;
  capturedExpression_00.m_start = "token.toString() == s";
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_00,(SourceLineInfo *)local_78,capturedExpression_00,
             ContinueOnFailure);
  slang::parsing::Token::toString_abi_cxx11_(&local_98,&token);
  _Var1 = std::operator==(&local_98,s);
  local_70._0_2_ = CONCAT11(_Var1,true);
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b63d00;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_68._M_allocated_capacity = (size_type)&local_98;
  local_50 = s;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  std::__cxx11::string::~string((string *)&local_98);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_78 = (undefined1  [8])0x88d9a8;
  local_70 = 0x2ce;
  capturedExpression_01.m_size = 0x28;
  capturedExpression_01.m_start = "token.numericFlags().unit() == flagCheck";
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_01,(SourceLineInfo *)local_78,capturedExpression_01,
             ContinueOnFailure);
  NVar2 = slang::parsing::Token::numericFlags(&token);
  local_50 = (string *)&flagCheck_local;
  local_70._0_2_ = CONCAT11((NVar2.raw >> 3 & (Picoseconds|Nanoseconds)) == flagCheck_local,true);
  local_98._M_dataplus._M_p._0_2_ =
       CONCAT11(local_98._M_dataplus._M_p._1_1_,NVar2.raw >> 3) & 0xff07;
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b65a98;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_68._M_allocated_capacity = (size_type)&local_98;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_78 = (undefined1  [8])0x88d9a8;
  local_70 = 0x2cf;
  capturedExpression_02.m_size = 0x18;
  capturedExpression_02.m_start = "token.realValue() == num";
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName_02,(SourceLineInfo *)local_78,capturedExpression_02,
             ContinueOnFailure);
  local_68._M_allocated_capacity = (size_type)slang::parsing::Token::realValue(&token);
  local_70._0_2_ = CONCAT11((double)local_68._M_allocated_capacity == local_48,true);
  local_78 = (undefined1  [8])&PTR_streamReconstructedExpression_00b65ac8;
  local_68._8_8_ = (long)"!==" + 1;
  local_58 = 2;
  local_50 = (string *)local_48;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,(ITransientExpression *)local_78);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  sourceManager = getSourceManager();
  slang::Diagnostics::sort((Diagnostics *)&slang::diagnostics,sourceManager);
  if (DAT_00b8c868 != 0) {
    local_78 = (undefined1  [8])0x88d9a8;
    local_70 = 0x2d0;
    macroName_03.m_size = 10;
    macroName_03.m_start = "FAIL_CHECK";
    Catch::AssertionHandler::AssertionHandler
              (&catchAssertionHandler,macroName_03,(SourceLineInfo *)local_78,
               (StringRef)ZEXT816(0x88e35c),ContinueOnFailure);
    local_a8.m_index = 0;
    local_a8.m_oss = (ostream *)0x0;
    Catch::ReusableStringStream::ReusableStringStream(&local_a8);
    reportGlobalDiags_abi_cxx11_();
    std::operator<<(local_a8.m_oss,(string *)&local_98);
    Catch::ReusableStringStream::str_abi_cxx11_((string *)local_78,&local_a8);
    Catch::AssertionHandler::handleMessage
              (&catchAssertionHandler,ExplicitFailure,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&local_98);
    Catch::ReusableStringStream::~ReusableStringStream(&local_a8);
    Catch::AssertionHandler::complete(&catchAssertionHandler);
    Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  }
  return;
}

Assistant:

void checkTimeLiteral(const std::string& s, TimeUnit flagCheck, double num) {
    Token token = lexToken(s);

    CHECK(token.kind == TokenKind::TimeLiteral);
    CHECK(token.toString() == s);
    CHECK(token.numericFlags().unit() == flagCheck);
    CHECK(token.realValue() == num);
    CHECK_DIAGNOSTICS_EMPTY;
}